

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O3

void tinyobj::InitMaterial(material_t *material)

{
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->name,0,(material->name)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->ambient_texname,0,(material->ambient_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->diffuse_texname,0,(material->diffuse_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->specular_texname,0,(material->specular_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->specular_highlight_texname,0,
             (material->specular_highlight_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->bump_texname,0,(material->bump_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->displacement_texname,0,(material->displacement_texname)._M_string_length,"",
             0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->reflection_texname,0,(material->reflection_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->alpha_texname,0,(material->alpha_texname)._M_string_length,"",0);
  material->ambient[0] = 0.0;
  material->ambient[1] = 0.0;
  *(undefined8 *)(material->ambient + 2) = 0;
  material->diffuse[1] = 0.0;
  material->diffuse[2] = 0.0;
  material->specular[0] = 0.0;
  material->specular[1] = 0.0;
  *(undefined8 *)(material->specular + 2) = 0;
  material->transmittance[1] = 0.0;
  material->transmittance[2] = 0.0;
  *(undefined8 *)(material->transmittance + 2) = 0;
  material->emission[1] = 0.0;
  material->emission[2] = 0.0;
  material->dissolve = 1.0;
  material->illum = 0;
  material->shininess = 1.0;
  material->ior = 1.0;
  material->roughness = 0.0;
  material->metallic = 0.0;
  material->sheen = 0.0;
  material->clearcoat_thickness = 0.0;
  material->clearcoat_thickness = 0.0;
  material->clearcoat_roughness = 0.0;
  material->anisotropy = 0.0;
  material->anisotropy_rotation = 0.0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->roughness_texname,0,(material->roughness_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->metallic_texname,0,(material->metallic_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->sheen_texname,0,(material->sheen_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->emissive_texname,0,(material->emissive_texname)._M_string_length,"",0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&material->normal_texname,0,(material->normal_texname)._M_string_length,"",0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&(material->unknown_parameter)._M_t);
  return;
}

Assistant:

static void InitMaterial(material_t *material) {
  material->name = "";
  material->ambient_texname = "";
  material->diffuse_texname = "";
  material->specular_texname = "";
  material->specular_highlight_texname = "";
  material->bump_texname = "";
  material->displacement_texname = "";
  material->reflection_texname = "";
  material->alpha_texname = "";
  for (int i = 0; i < 3; i++) {
    material->ambient[i] = 0.f;
    material->diffuse[i] = 0.f;
    material->specular[i] = 0.f;
    material->transmittance[i] = 0.f;
    material->emission[i] = 0.f;
  }
  material->illum = 0;
  material->dissolve = 1.f;
  material->shininess = 1.f;
  material->ior = 1.f;

  material->roughness = 0.f;
  material->metallic = 0.f;
  material->sheen = 0.f;
  material->clearcoat_thickness = 0.f;
  material->clearcoat_roughness = 0.f;
  material->anisotropy_rotation = 0.f;
  material->anisotropy = 0.f;
  material->roughness_texname = "";
  material->metallic_texname = "";
  material->sheen_texname = "";
  material->emissive_texname = "";
  material->normal_texname = "";

  material->unknown_parameter.clear();
}